

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseNamespace(Parser *this)

{
  bool bVar1;
  Namespace *pNVar2;
  Parser *in_RSI;
  Namespace *local_38;
  Namespace *ns;
  byte local_19;
  Parser *this_local;
  CheckedError *ce;
  
  local_19 = 0;
  this_local = this;
  Next(this);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (bVar1) {
    local_19 = 1;
  }
  ns._0_4_ = (uint)bVar1;
  if ((local_19 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if ((uint)ns == 0) {
    pNVar2 = (Namespace *)operator_new(0x20);
    Namespace::Namespace(pNVar2);
    local_38 = pNVar2;
    std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::push_back
              (&in_RSI->namespaces_,&local_38);
    if ((in_RSI->super_ParserState).token_ == 0x3b) {
LAB_001412bf:
      std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::pop_back
                (&in_RSI->namespaces_);
      pNVar2 = UniqueNamespace(in_RSI,local_38);
      in_RSI->current_namespace_ = pNVar2;
      Expect(this,(int)in_RSI);
      bVar1 = CheckedError::Check((CheckedError *)this);
      ns._0_4_ = (uint)bVar1;
      if (!bVar1) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if ((uint)ns == 0) {
        anon_unknown_0::NoError();
      }
    }
    else {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_38->components,&(in_RSI->super_ParserState).attribute_);
        Expect(this,(int)in_RSI);
        bVar1 = CheckedError::Check((CheckedError *)this);
        ns._0_4_ = (uint)bVar1;
        if (!bVar1) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if ((uint)ns != 0) break;
        bVar1 = Is(in_RSI,0x2e);
        if (!bVar1) goto LAB_001412bf;
        Next(this);
        bVar1 = CheckedError::Check((CheckedError *)this);
        ns._0_4_ = (uint)bVar1;
        if (!bVar1) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      } while ((uint)ns == 0);
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNamespace() {
  NEXT();
  auto ns = new Namespace();
  namespaces_.push_back(ns);  // Store it here to not leak upon error.
  if (token_ != ';') {
    for (;;) {
      ns->components.push_back(attribute_);
      EXPECT(kTokenIdentifier);
      if (Is('.')) NEXT() else break;
    }
  }
  namespaces_.pop_back();
  current_namespace_ = UniqueNamespace(ns);
  EXPECT(';');
  return NoError();
}